

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

Expected<llvm::sys::fs::TempFile> *
llvm::sys::fs::TempFile::create
          (Expected<llvm::sys::fs::TempFile> *__return_storage_ptr__,Twine *Model,uint Mode)

{
  bool bVar1;
  error_code eVar2;
  StringRef Name;
  error_code EC;
  StringRef Filename;
  int FD;
  Error local_e8;
  undefined1 local_e0 [16];
  TempFile Ret;
  SmallString<128U> ResultPath;
  
  ResultPath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &ResultPath.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
  ResultPath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  ResultPath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  eVar2 = createUniqueEntity(Model,&FD,(SmallVectorImpl<char> *)&ResultPath,false,Mode,FS_File,
                             OF_Delete);
  if (eVar2._M_value == 0) {
    Name.Length._0_4_ =
         ResultPath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.Size;
    Name.Data = (char *)ResultPath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                        super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    Name.Length._4_4_ = 0;
    TempFile(&Ret,Name,FD);
    Filename.Length._0_4_ =
         ResultPath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.Size;
    Filename.Data =
         (char *)ResultPath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    Filename.Length._4_4_ = 0;
    bVar1 = RemoveFileOnSignal(Filename,(string *)0x0);
    if (bVar1) {
      discard((TempFile *)local_e0);
      consumeError((Error *)local_e0);
      if ((long *)(local_e0._0_8_ & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_e0._0_8_ & 0xfffffffffffffffe) + 8))();
      }
      std::_V2::generic_category();
      eVar2._M_cat = (error_category *)0x1;
      eVar2._0_8_ = &local_e8;
      errorCodeToError(eVar2);
      Expected<llvm::sys::fs::TempFile>::Expected(__return_storage_ptr__,&local_e8);
      if ((long *)((ulong)local_e8.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_e8.Payload & 0xfffffffffffffffe) + 8))();
      }
    }
    else {
      Expected<llvm::sys::fs::TempFile>::Expected<llvm::sys::fs::TempFile>
                (__return_storage_ptr__,&Ret,(type *)0x0);
    }
    ~TempFile(&Ret);
  }
  else {
    EC._M_cat._0_4_ = eVar2._M_value;
    EC._0_8_ = (Error *)(local_e0 + 8);
    EC._M_cat._4_4_ = 0;
    errorCodeToError(EC);
    Expected<llvm::sys::fs::TempFile>::Expected(__return_storage_ptr__,(Error *)(local_e0 + 8));
    if ((long *)(local_e0._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_e0._8_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&ResultPath);
  return __return_storage_ptr__;
}

Assistant:

Expected<TempFile> TempFile::create(const Twine &Model, unsigned Mode) {
  int FD;
  SmallString<128> ResultPath;
  if (std::error_code EC =
          createUniqueFile(Model, FD, ResultPath, Mode, OF_Delete))
    return errorCodeToError(EC);

  TempFile Ret(ResultPath, FD);
#ifndef _WIN32
  if (sys::RemoveFileOnSignal(ResultPath)) {
    // Make sure we delete the file when RemoveFileOnSignal fails.
    consumeError(Ret.discard());
    std::error_code EC(errc::operation_not_permitted);
    return errorCodeToError(EC);
  }
#endif
  return std::move(Ret);
}